

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool __thiscall units::measurement::operator==(measurement *this,measurement *other)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  
  dVar3 = value_as(other,&this->units_);
  dVar1 = this->value_;
  if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
    return true;
  }
  bVar2 = detail::compare_round_equals((float)dVar1,(float)dVar3);
  return bVar2;
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = other.value_as(units_);
        return (value_ == val) ?
            true :
            detail::compare_round_equals(
                static_cast<float>(value_), static_cast<float>(val));
    }